

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O3

void density::detail::
     LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
     ::cancel_put_nodestroy_impl(Allocation *i_put)

{
  uintptr_t uVar1;
  
  if ((0xf < (i_put->m_control_block->m_next ^ i_put->m_next_ptr)) ||
     (uVar1 = i_put->m_next_ptr, ((uint)uVar1 & 3) != 1)) {
    density_tests::detail::assert_failed<>
              ("(i_put.m_next_ptr & ~LfQueue_AllFlags) == (raw_atomic_load(&i_put.m_control_block->m_next, mem_relaxed) & ~LfQueue_AllFlags) && (i_put.m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Busy"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_base.h"
               ,0x1c8);
    uVar1 = i_put->m_next_ptr;
  }
  LOCK();
  i_put->m_control_block->m_next = uVar1 + 1;
  UNLOCK();
  return;
}

Assistant:

static void cancel_put_nodestroy_impl(const Allocation & i_put) noexcept
            {
                // we expect to have LfQueue_Busy and not LfQueue_Dead
                DENSITY_ASSUME_ALIGNED(i_put.m_control_block, s_alloc_granularity);
                DENSITY_ASSERT_INTERNAL(
                  (i_put.m_next_ptr & ~LfQueue_AllFlags) ==
                    (raw_atomic_load(&i_put.m_control_block->m_next, mem_relaxed) &
                     ~LfQueue_AllFlags) &&
                  (i_put.m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Busy);

                // remove LfQueue_Busy and add LfQueue_Dead
                auto const addend =
                  static_cast<uintptr_t>(LfQueue_Dead) - static_cast<uintptr_t>(LfQueue_Busy);
                raw_atomic_store(
                  &i_put.m_control_block->m_next, i_put.m_next_ptr + addend, mem_release);
            }